

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char16_t * u16tou16(char16_t *source)

{
  long lVar1;
  size_t sVar2;
  char16_t *pcVar3;
  char16_t *p1;
  char16_t *pcVar4;
  char16_t cVar5;
  size_t __size;
  
  if (source == (char16_t *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  }
  else {
    cVar5 = *source;
    if (cVar5 == 0) {
      __size = 1;
    }
    else {
      sVar2 = 1;
      do {
        __size = sVar2 + 2;
        lVar1 = sVar2 + 1;
        sVar2 = __size;
      } while (*(short *)((long)source + lVar1) != 0);
    }
    pcVar3 = (char16_t *)malloc(__size);
    pcVar4 = pcVar3;
    if (pcVar3 != (char16_t *)0x0) {
      do {
        source = source + (cVar5 != 0);
        *pcVar4 = cVar5;
        cVar5 = *source;
        pcVar4 = pcVar4 + 1;
      } while (cVar5 != 0);
      return pcVar3;
    }
    g_lastError = OPENJTALKERROR_MALLOC_ERROR;
  }
  return (char16_t *)0x0;
}

Assistant:

char16_t *u16tou16(const char16_t *source)
{
	if (source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char16_t *temp = (char16_t *)malloc(strlenU16(source) * sizeof(char16_t) + 1);
	if (!temp)
	{
		g_lastError = OPENJTALKERROR_MALLOC_ERROR;
		return NULL;
	}
	return strcpyU16(temp, source);
}